

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

void bin_linear(IntVar *x,IntVar *y,IntRelType t,int c)

{
  int c_00;
  ulong uVar1;
  undefined8 uVar2;
  IntRelType t_00;
  ulong uVar3;
  longdouble ub;
  longdouble lb;
  IntView<0> x_00;
  IntView<0> y_00;
  vec<IntVar_*> local_58;
  vec<int> local_48;
  IntVar *y_local;
  IntVar *x_local;
  
  y_local = y;
  x_local = x;
  if (IRT_GT < t) {
switchD_0018ebda_caseD_1:
    uVar2 = 0xec;
    goto LAB_0018ed46;
  }
  switch(t) {
  case IRT_EQ:
    bin_linear(x,y,IRT_LE,c);
    t_00 = IRT_GE;
    c_00 = c;
    break;
  case IRT_NE:
    goto switchD_0018ebda_caseD_1;
  case IRT_LE:
    uVar3 = (ulong)(uint)c << 0x20 | 0xffffffff;
    uVar1 = 1;
    goto LAB_0018ec47;
  case IRT_LT:
    c_00 = c + -1;
    t_00 = IRT_LE;
    break;
  case IRT_GE:
    uVar1 = (ulong)(uint)c << 0x20 | 0xffffffff;
    uVar3 = 1;
LAB_0018ec47:
    x_00.a = (int)uVar3;
    x_00.b = (int)(uVar3 >> 0x20);
    x_00.var = x;
    y_00.a = (int)uVar1;
    y_00.b = (int)(uVar1 >> 0x20);
    y_00.var = y;
    newBinGE(x_00,y_00,&bv_true);
    goto LAB_0018ec52;
  case IRT_GT:
    c_00 = c + 1;
    t_00 = IRT_GE;
  }
  bin_linear(x,y,t_00,c_00);
LAB_0018ec52:
  local_58.sz = 1;
  vec<int>::vec(&local_48,2,(int *)&local_58);
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (IntVar **)0x0;
  vec<IntVar_*>::push(&local_58,&x_local);
  vec<IntVar_*>::push(&local_58,&y_local);
  switch(t) {
  case IRT_EQ:
  case IRT_LT:
  case IRT_GT:
    goto switchD_0018eca7_caseD_0;
  default:
    uVar2 = 0x103;
LAB_0018ed46:
    fprintf(_stderr,"%s:%d: ","binary.cpp",uVar2);
    fwrite("Assertion failed.\n",0x12,1,_stderr);
    abort();
  case IRT_LE:
    lb = (longdouble)-1e+100;
    ub = (longdouble)c;
    break;
  case IRT_GE:
    ub = (longdouble)1e+100;
    lb = (longdouble)c;
  }
  MIP::addConstraint(mip,&local_48,&local_58,lb,ub);
switchD_0018eca7_caseD_0:
  free(local_58.data);
  free(local_48.data);
  return;
}

Assistant:

void bin_linear(IntVar* x, IntVar* y, IntRelType t, int c) {
	switch (t) {
		case IRT_EQ:
			bin_linear(x, y, IRT_LE, c);
			bin_linear(x, y, IRT_GE, c);
			break;
		case IRT_LE:
			// x + y <= c <=> (-x+c) >= y
			newBinGE(IntView<>(x, -1, c), IntView<>(y));
			break;
		case IRT_LT:
			bin_linear(x, y, IRT_LE, c - 1);
			break;
		case IRT_GE:
			// x + y >= c <=> x >= (-y+c)
			newBinGE(IntView<>(x), IntView<>(y, -1, c));
			break;
		case IRT_GT:
			bin_linear(x, y, IRT_GE, c + 1);
			break;
		default:
			NEVER;
	}

	vec<int> coeffs(2, 1);
	vec<IntVar*> vars;

	vars.push(x);
	vars.push(y);

	switch (t) {
		case IRT_EQ:
			break;
		case IRT_LE:
			mip->addConstraint(coeffs, vars, -1e100, c);
			break;
		case IRT_LT:
			break;
		case IRT_GE:
			mip->addConstraint(coeffs, vars, c, 1e100);
			break;
		case IRT_GT:
			break;
		default:
			NEVER;
	}
}